

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

Bigint * multadd(Bigint *b,int m,int a)

{
  int iVar1;
  Bigint *pBVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = b->wds;
  uVar5 = (ulong)a;
  lVar3 = 0;
  do {
    uVar4 = (ulong)b->x[lVar3] * (long)m + uVar5;
    uVar5 = uVar4 >> 0x20;
    b->x[lVar3] = (uint32)uVar4;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 < iVar1);
  pBVar2 = b;
  if (uVar4 >> 0x20 != 0) {
    if (b->maxwds <= iVar1) {
      pBVar2 = Balloc(b->k + 1);
      if (pBVar2 == (Bigint *)0x0) {
        Bfree(b);
        return (Bigint *)0x0;
      }
      memcpy(&pBVar2->sign,&b->sign,(long)b->wds * 4 + 8);
      Bfree(b);
    }
    pBVar2->x[iVar1] = (uint32)(uVar4 >> 0x20);
    pBVar2->wds = iVar1 + 1;
  }
  return pBVar2;
}

Assistant:

static Bigint *
multadd(Bigint *b, int m, int a)       /* multiply by m and add a */
{
    int i, wds;
#ifdef ULLong
    ULong *x;
    ULLong carry, y;
#else
    ULong carry, *x, y;
    ULong xi, z;
#endif
    Bigint *b1;

    wds = b->wds;
    x = b->x;
    i = 0;
    carry = a;
    do {
#ifdef ULLong
        y = *x * (ULLong)m + carry;
        carry = y >> 32;
        *x++ = (ULong)(y & FFFFFFFF);
#else
        xi = *x;
        y = (xi & 0xffff) * m + carry;
        z = (xi >> 16) * m + (y >> 16);
        carry = z >> 16;
        *x++ = (z << 16) + (y & 0xffff);
#endif
    }
    while(++i < wds);
    if (carry) {
        if (wds >= b->maxwds) {
            b1 = Balloc(b->k+1);
            if (b1 == NULL){
                Bfree(b);
                return NULL;
            }
            Bcopy(b1, b);
            Bfree(b);
            b = b1;
        }
        b->x[wds++] = (ULong)carry;
        b->wds = wds;
    }
    return b;
}